

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O2

int tga_test(stbi *s)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  
  get8(s);
  uVar1 = get8(s);
  uVar3 = 0;
  if ((uVar1 & 0xfe) == 0) {
    iVar2 = get8(s);
    if (0xfc < (byte)(((byte)iVar2 & 0xf7) - 4)) {
      get16(s);
      get16(s);
      get8(s);
      get16(s);
      get16(s);
      iVar2 = get16(s);
      if (0 < iVar2) {
        iVar2 = get16(s);
        uVar3 = 0;
        if (0 < iVar2) {
          iVar2 = get8(s);
          uVar3 = (uint)((iVar2 - 8U & 0xffffffe7) == 0);
        }
      }
    }
  }
  return uVar3;
}

Assistant:

static int tga_test(stbi *s)
{
	int sz;
	get8u(s);		//	discard Offset
	sz = get8u(s);	//	color type
	if( sz > 1 ) return 0;	//	only RGB or indexed allowed
	sz = get8u(s);	//	image type
	if( (sz != 1) && (sz != 2) && (sz != 3) && (sz != 9) && (sz != 10) && (sz != 11) ) return 0;	//	only RGB or grey allowed, +/- RLE
	get16(s);		//	discard palette start
	get16(s);		//	discard palette length
	get8(s);			//	discard bits per palette color entry
	get16(s);		//	discard x origin
	get16(s);		//	discard y origin
	if( get16(s) < 1 ) return 0;		//	test width
	if( get16(s) < 1 ) return 0;		//	test height
	sz = get8(s);	//	bits per pixel
	if( (sz != 8) && (sz != 16) && (sz != 24) && (sz != 32) ) return 0;	//	only RGB or RGBA or grey allowed
	return 1;		//	seems to have passed everything
}